

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::OP_ScopedInitFunc<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementScopedC<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  Var value;
  Var value_00;
  PropertyId propertyId;
  FrameDisplay *pScope;
  
  if ((~*(ushort *)(*(long *)(this + 0x88) + 0x45) & 0x1100) == 0) {
    pScope = GetLocalFrameDisplay(this);
  }
  else {
    pScope = *(FrameDisplay **)(*(long *)(this + 0x80) + 0x30);
  }
  propertyId = FunctionBody::GetReferencedPropertyId
                         (*(FunctionBody **)(this + 0x88),playout->PropertyIdIndex);
  value = *(Var *)(this + (ulong)playout->Value * 8 + 0x160);
  ValidateRegValue(this,value,false,true);
  value_00 = *(Var *)(this + 0x168);
  ValidateRegValue(this,value_00,false,true);
  JavascriptOperators::OP_InitFuncScoped
            (pScope,propertyId,value,value_00,*(ScriptContext **)(this + 0x78));
  return;
}

Assistant:

void InterpreterStackFrame::OP_ScopedInitFunc(const unaligned OpLayoutT_ElementScopedC<T> * playout)
    {
        JavascriptOperators::OP_InitFuncScoped(GetEnvForEvalCode(),
            m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex),
            GetReg(playout->Value), GetReg(Js::FunctionBody::RootObjectRegSlot), GetScriptContext());
    }